

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O2

void __thiscall cmRST::ProcessRST(cmRST *this,istream *is)

{
  bool bVar1;
  string line;
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  while( true ) {
    bVar1 = cmsys::SystemTools::GetLineFromStream(is,&line,(bool *)0x0,-1);
    if (!bVar1) break;
    ProcessLine(this,&line);
  }
  Reset(this);
  std::__cxx11::string::~string((string *)&line);
  return;
}

Assistant:

void cmRST::ProcessRST(std::istream& is)
{
  std::string line;
  while(cmSystemTools::GetLineFromStream(is, line))
    {
    this->ProcessLine(line);
    }
  this->Reset();
}